

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_fs_open(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  char local_482 [8];
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_buf_t buf;
  uv_write_t write_req2;
  uv_write_t write_req;
  uv_pipe_t in;
  uv_fs_t fs_req;
  int local_10;
  uv_os_fd_t dup_fd;
  uv_os_fd_t fd;
  int r;
  
  builtin_strncpy(local_482,"/dev/nul",8);
  dev_null[0] = 'l';
  dev_null[1] = '\0';
  dup_fd = uv_fs_open(0,&in.pipe_fname,local_482,2,0);
  if (dup_fd == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x63d,"r != -1");
    abort();
  }
  local_10 = uv_get_osfhandle((ulong)fs_req.cb & 0xffffffff);
  uv_fs_req_cleanup(&in.pipe_fname);
  init_process_options("spawn_helper8",exit_cb);
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&write_req.bufsml[3].len,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x643,"0 == uv_pipe_init(uv_default_loop(), &in, 0)");
    abort();
  }
  options.stdio = (uv_stdio_container_t *)(dev_null + 2);
  dev_null[2] = '\x11';
  dev_null[3] = '\0';
  dev_null[4] = '\0';
  dev_null[5] = '\0';
  stdio[0]._0_8_ = &write_req.bufsml[3].len;
  options.stdio_count = 1;
  fs_req.bufsml[3].len._4_4_ = dup(local_10);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x656,"0 == uv_spawn(uv_default_loop(), &process, &options)");
    abort();
  }
  auVar3 = uv_buf_init(&local_10,4);
  buf.base = auVar3._8_8_;
  stdio[0].data = auVar3._0_8_;
  iVar1 = uv_write(&write_req2.bufsml[3].len,&write_req.bufsml[3].len,&stdio[0].data,1,write_null_cb
                  );
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x659,"0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb)");
    abort();
  }
  auVar3 = uv_buf_init((undefined1 *)((long)&fs_req.bufsml[3].len + 4),4);
  buf.base = auVar3._8_8_;
  stdio[0].data = auVar3._0_8_;
  iVar1 = uv_write(&buf.len,&write_req.bufsml[3].len,&stdio[0].data,1,write_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x65c,"0 == uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x65e,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = uv_fs_close(0,&in.pipe_fname,dup_fd);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x65f,"0 == uv_fs_close(NULL, &fs_req, r, NULL)");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x661,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x662,"close_cb_called == 2");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x664,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, O_RDWR, 0, NULL);
  ASSERT(r != -1);
  fd = uv_get_osfhandle((uv_file) fs_req.result);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT(0 != DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                              0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT(pCompareObjectHandles == NULL || pCompareObjectHandles(fd, dup_fd));
#else
  dup_fd = dup(fd);
#endif

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, r, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}